

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElectricityBill.cpp
# Opt level: O0

void __thiscall
ElectricityBill::ElectricityBill(ElectricityBill *this,EventLoop *loop,string *text_root)

{
  string *this_00;
  byte bVar1;
  LogLevel LVar2;
  undefined8 uVar3;
  ElectricityBill *local_610;
  code *local_608;
  undefined8 local_600;
  type local_5f8;
  TimerCallback local_5e0;
  allocator<char> local_5b9;
  string local_5b8;
  undefined1 local_598 [8];
  Timer timer;
  Fmt local_528;
  Logger local_428;
  undefined1 local_210 [8];
  RoomInfo room_info;
  string local_1b0;
  undefined1 local_190 [8];
  string roomname;
  string flatname;
  undefined1 local_130 [8];
  FileForRead file_read;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  string *local_20;
  string *text_root_local;
  EventLoop *loop_local;
  ElectricityBill *this_local;
  
  this->loop_ = loop;
  local_20 = text_root;
  text_root_local = (string *)loop;
  loop_local = (EventLoop *)this;
  std::__cxx11::string::string((string *)&this->text_root_,(string *)text_root);
  std::operator+(&local_40,&this->text_root_,&ROOM_MAP_FILE_abi_cxx11_);
  higan::FileForAppend::FileForAppend(&this->room_file_,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  (this->room_informations_).super__Vector_base<RoomInfo,_std::allocator<RoomInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->room_informations_).super__Vector_base<RoomInfo,_std::allocator<RoomInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->room_informations_).super__Vector_base<RoomInfo,_std::allocator<RoomInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<RoomInfo,_std::allocator<RoomInfo>_>::vector(&this->room_informations_);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&flatname.field_2 + 8),local_20,&ROOM_MAP_FILE_abi_cxx11_);
  higan::FileForRead::FileForRead((FileForRead *)local_130,(string *)((long)&flatname.field_2 + 8));
  std::__cxx11::string::~string((string *)(flatname.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(roomname.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_190);
  while( true ) {
    higan::FileForRead::ReadLine_abi_cxx11_(&local_1b0,(FileForRead *)local_130);
    std::__cxx11::string::operator=
              ((string *)(roomname.field_2._M_local_buf + 8),(string *)&local_1b0);
    bVar1 = std::__cxx11::string::empty();
    std::__cxx11::string::~string((string *)&local_1b0);
    if (((bVar1 ^ 0xff) & 1) == 0) break;
    higan::FileForRead::ReadLine_abi_cxx11_
              ((string *)((long)&room_info.roomname.field_2 + 8),(FileForRead *)local_130);
    this_00 = (string *)(room_info.roomname.field_2._M_local_buf + 8);
    std::__cxx11::string::operator=((string *)local_190,this_00);
    std::__cxx11::string::~string(this_00);
    RoomInfo::RoomInfo((RoomInfo *)local_210,(string *)((long)&roomname.field_2 + 8),
                       (string *)local_190);
    std::vector<RoomInfo,_std::allocator<RoomInfo>_>::push_back
              (&this->room_informations_,(value_type *)local_210);
    LVar2 = higan::Logger::GetLogLevel();
    if ((int)LVar2 < 2) {
      higan::Logger::Logger
                (&local_428,INFO,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/HiganFish[P]higan/example/ElectricityBill/ElectricityBill.cpp"
                 ,0x21,"ElectricityBill");
      RoomInfo::GetRoomInfoString_abi_cxx11_
                ((string *)&timer.timer_callback_._M_invoker,(RoomInfo *)local_210);
      uVar3 = std::__cxx11::string::c_str();
      higan::Fmt::Fmt(&local_528,"read room: %s from file",uVar3);
      higan::Logger::operator<<(&local_428,&local_528);
      std::__cxx11::string::~string((string *)&timer.timer_callback_._M_invoker);
      higan::Logger::~Logger(&local_428);
    }
    RoomInfo::~RoomInfo((RoomInfo *)local_210);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_5b8,"QueryBill",&local_5b9);
  local_608 = QueryBill;
  local_600 = 0;
  local_610 = this;
  std::
  bind<void(ElectricityBill::*)(higan::Timer_const&),ElectricityBill*,std::_Placeholder<1>const&>
            (&local_5f8,(offset_in_ElectricityBill_to_subr *)&local_608,&local_610,
             (_Placeholder<1> *)&std::placeholders::_1);
  std::function<void(higan::Timer_const&)>::
  function<std::_Bind<void(ElectricityBill::*(ElectricityBill*,std::_Placeholder<1>))(higan::Timer_const&)>,void>
            ((function<void(higan::Timer_const&)> *)&local_5e0,&local_5f8);
  higan::Timer::Timer((Timer *)local_598,&local_5b8,3600000,true,&local_5e0);
  std::function<void_(const_higan::Timer_&)>::~function(&local_5e0);
  std::__cxx11::string::~string((string *)&local_5b8);
  std::allocator<char>::~allocator(&local_5b9);
  higan::EventLoop::AddTimer(this->loop_,(Timer *)local_598);
  higan::Timer::~Timer((Timer *)local_598);
  std::__cxx11::string::~string((string *)local_190);
  std::__cxx11::string::~string((string *)(roomname.field_2._M_local_buf + 8));
  higan::FileForRead::~FileForRead((FileForRead *)local_130);
  return;
}

Assistant:

ElectricityBill::ElectricityBill(higan::EventLoop* loop, const std::string& text_root):
		loop_(loop),
		text_root_(text_root),
		room_file_(text_root_ + ROOM_MAP_FILE),
		room_informations_()
{
	higan::FileForRead file_read(text_root + ROOM_MAP_FILE);

	std::string flatname;
	std::string roomname;
	while (!(flatname = file_read.ReadLine()).empty())
	{
		roomname = file_read.ReadLine();

		RoomInfo room_info(flatname, roomname);
		room_informations_.push_back(room_info);

		LOG_INFO << higan::Fmt("read room: %s from file", room_info.GetRoomInfoString().c_str());
	}

	higan::Timer timer{"QueryBill", 60 * 60 * 1000, true,
					std::bind(&ElectricityBill::QueryBill, this, std::placeholders::_1)};
	loop_->AddTimer(timer);

}